

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O2

void __thiscall tst_InsertProxyModel::testSourceInsertRow(tst_InsertProxyModel *this)

{
  uint uVar1;
  QObject *pQVar2;
  char cVar3;
  bool bVar4;
  byte bVar5;
  undefined1 uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  undefined4 uVar10;
  int iVar11;
  undefined8 *puVar12;
  uint *puVar13;
  undefined1 *puVar14;
  ModelTest *this_00;
  ulong uVar15;
  int j;
  uint uVar16;
  int i;
  QModelIndex *pQVar17;
  InsertDirections insertDirection;
  anon_union_24_3_e3d07ef4_for_data local_240;
  QObject *local_220;
  anon_union_24_3_e3d07ef4_for_data local_218;
  undefined8 local_200;
  QModelIndex local_1f0;
  QModelIndex local_1d8;
  InsertProxyModel proxy;
  QModelIndex local_1a0;
  QArrayDataPointer<char16_t> local_188;
  QModelIndex *local_168;
  int local_15c;
  ulong local_158;
  uint local_14c;
  QList<QVariant> args;
  QSignalSpy baseRowsInsertedSpy;
  QSignalSpy proxyRowsInsertedSpy;
  
  iVar7 = qMetaTypeId<QAbstractItemModel*>();
  puVar12 = (undefined8 *)QTest::qData("baseModel",iVar7);
  pQVar2 = (QObject *)*puVar12;
  iVar7 = qMetaTypeId<QFlags<InsertProxyModel::InsertDirection>>();
  puVar13 = (uint *)QTest::qData("insertDirection",iVar7);
  uVar16 = *puVar13;
  puVar13 = (uint *)QTest::qData("indexToInsert",2);
  uVar1 = *puVar13;
  pQVar17 = (QModelIndex *)(ulong)uVar1;
  puVar14 = (undefined1 *)QTest::qData("addViaProxy",1);
  uVar6 = *puVar14;
  InsertProxyModel::InsertProxyModel(&proxy,(QObject *)0x0);
  this_00 = (ModelTest *)operator_new(0x10);
  ModelTest::ModelTest(this_00,(QAbstractItemModel *)&proxy,pQVar2);
  InsertProxyModel::setSourceModel((QAbstractItemModel *)&proxy);
  InsertProxyModel::setInsertDirection(&proxy);
  QSignalSpy::QSignalSpy
            (&proxyRowsInsertedSpy,(QObject *)&proxy,"2rowsInserted(QModelIndex, int, int)");
  cVar3 = QTest::qVerify(proxyRowsInsertedSpy.sig.d.size != 0,"proxyRowsInsertedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                         ,0x148);
  if (cVar3 == '\0') goto LAB_0010ef59;
  QSignalSpy::QSignalSpy(&baseRowsInsertedSpy,pQVar2,"2rowsInserted(QModelIndex, int, int)");
  local_158 = CONCAT71(local_158._1_7_,uVar6);
  local_220 = pQVar2;
  cVar3 = QTest::qVerify(baseRowsInsertedSpy.sig.d.size != 0,"baseRowsInsertedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                         ,0x14a);
  pQVar2 = local_220;
  if (cVar3 != '\0') {
    local_240._forAlignment = -NAN;
    local_240._8_8_ = 0;
    local_240._16_8_ = 0;
    iVar7 = (**(code **)(*(long *)local_220 + 0x80))(local_220);
    local_240._forAlignment = -NAN;
    local_240._8_8_ = 0;
    local_240._16_8_ = 0;
    uVar8 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2);
    local_240._forAlignment = -NAN;
    local_240._8_8_ = 0;
    local_240._16_8_ = 0;
    iVar9 = InsertProxyModel::rowCount((QModelIndex *)&proxy);
    local_168 = (QModelIndex *)(ulong)uVar8;
    cVar3 = QTest::qCompare(iVar9,(uVar16 & 1) + uVar8,"proxy.rowCount()",
                            "originalRowCount + bool(insertDirection & InsertProxyModel::InsertRow)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                            ,0x14d);
    if (cVar3 != '\0') {
      local_240._forAlignment = -NAN;
      local_240._8_8_ = 0;
      local_240._16_8_ = 0;
      iVar9 = InsertProxyModel::columnCount((QModelIndex *)&proxy);
      cVar3 = QTest::qCompare(iVar9,iVar7 + (uint)((uVar16 >> 1 & 1) != 0),"proxy.columnCount()",
                              "originalColCount + bool(insertDirection & InsertProxyModel::InsertColumn)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                              ,0x14e);
      if (cVar3 != '\0') {
        if ((uVar16 & 1) == 0) {
LAB_0010df7e:
          if ((uVar16 & 2) != 0) {
            if (0 < (int)uVar1) {
              args.d.d = (Data *)0xffffffffffffffff;
              args.d.ptr = (QVariant *)0x0;
              args.d.size = 0;
              InsertProxyModel::index((int)&local_218,(int)&proxy,(QModelIndex *)(ulong)(uVar1 - 1))
              ;
              local_1f0.r = 0;
              local_1f0.c = 0;
              local_1f0.i = 0x11f860;
              local_1f0.m = (QAbstractItemModel *)0x10;
              local_1d8.r = 0;
              local_1d8.c = 0;
              local_1d8.i = 0;
              local_1d8.m = (QAbstractItemModel *)0x0;
              QVariant::QVariant((QVariant *)&local_240,(QString *)&local_1f0);
              bVar4 = (bool)InsertProxyModel::setData
                                      ((QModelIndex *)&proxy,(QVariant *)&local_218,(int)&local_240)
              ;
              cVar3 = QTest::qVerify(bVar4,
                                     "proxy.setData(proxy.index(indexToInsert - 1, originalColCount), QStringLiteral(\"TestColumnBefore\"))"
                                     ,"",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                     ,0x155);
              QVariant::~QVariant((QVariant *)&local_240);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_1f0);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_1d8);
              if (cVar3 == '\0') goto LAB_0010ef4c;
            }
            if ((int)uVar1 < (int)local_168) {
              args.d.d = (Data *)0xffffffffffffffff;
              args.d.ptr = (QVariant *)0x0;
              args.d.size = 0;
              InsertProxyModel::index((int)&local_218,(int)&proxy,pQVar17);
              local_1f0.r = 0;
              local_1f0.c = 0;
              local_1f0.i = 0x11f882;
              local_1f0.m = (QAbstractItemModel *)0xf;
              local_1d8.r = 0;
              local_1d8.c = 0;
              local_1d8.i = 0;
              local_1d8.m = (QAbstractItemModel *)0x0;
              QVariant::QVariant((QVariant *)&local_240,(QString *)&local_1f0);
              bVar4 = (bool)InsertProxyModel::setData
                                      ((QModelIndex *)&proxy,(QVariant *)&local_218,(int)&local_240)
              ;
              cVar3 = QTest::qVerify(bVar4,
                                     "proxy.setData(proxy.index(indexToInsert, originalColCount), QStringLiteral(\"TestColumnAfter\"))"
                                     ,"",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                     ,0x157);
              QVariant::~QVariant((QVariant *)&local_240);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_1f0);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_1d8);
              if (cVar3 == '\0') goto LAB_0010ef4c;
            }
          }
          uVar8 = 0;
          local_15c = 0;
          if (0 < iVar7) {
            local_15c = iVar7;
          }
          uVar15 = 0;
          if (0 < (int)local_168) {
            uVar15 = (ulong)local_168 & 0xffffffff;
          }
          local_14c = (uint)uVar15;
          for (; uVar8 != (uint)uVar15; uVar8 = uVar8 + 1) {
            iVar9 = 0;
            while (local_15c != iVar9) {
              local_1f0.r = -1;
              local_1f0.c = -1;
              local_1f0.i = 0;
              local_1f0.m = (QAbstractItemModel *)0x0;
              InsertProxyModel::index
                        ((int)(QModelIndex *)&args,(int)&proxy,(QModelIndex *)(ulong)uVar8);
              QModelIndex::data((QVariant *)&local_240,(QModelIndex *)&args,0);
              local_1a0.r = -1;
              local_1a0.c = -1;
              local_1a0.i = 0;
              local_1a0.m = (QAbstractItemModel *)0x0;
              (**(code **)(*(long *)local_220 + 0x60))(&local_1d8,local_220,uVar8,iVar9,&local_1a0);
              QModelIndex::data((QVariant *)&local_218,&local_1d8,0);
              bVar4 = QTest::qCompare<QVariant,QVariant>
                                ((QVariant *)&local_240,(QVariant *)&local_218,
                                 "proxy.index(i, j).data()","baseModel->index(i, j).data()",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                 ,0x15b);
              QVariant::~QVariant((QVariant *)&local_218);
              QVariant::~QVariant((QVariant *)&local_240);
              iVar9 = iVar9 + 1;
              if (!bVar4) goto LAB_0010ef4c;
            }
            uVar15 = (ulong)local_14c;
          }
          if ((char)local_158 == '\0') {
            local_240._forAlignment = -NAN;
            local_240._8_8_ = 0;
            local_240._16_8_ = 0;
            bVar4 = (bool)(**(code **)(*(long *)local_220 + 0xf8))(local_220,pQVar17,1);
            cVar3 = QTest::qVerify(bVar4,"baseModel->insertRow(indexToInsert)","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                   ,0x161);
          }
          else {
            local_240._forAlignment = -NAN;
            local_240._8_8_ = 0;
            local_240._16_8_ = 0;
            bVar4 = (bool)(**(code **)(_proxy + 0xf8))(&proxy,pQVar17,1);
            cVar3 = QTest::qVerify(bVar4,"proxy.insertRow(indexToInsert)","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                   ,0x15f);
          }
          if ((cVar3 != '\0') &&
             (cVar3 = QTest::qCompare(baseRowsInsertedSpy.super_QList<QList<QVariant>_>.d.size,1,
                                      "baseRowsInsertedSpy.count()","1",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                      ,0x162), cVar3 != '\0')) {
            QList<QList<QVariant>_>::clear(&baseRowsInsertedSpy.super_QList<QList<QVariant>_>);
            cVar3 = QTest::qCompare(proxyRowsInsertedSpy.super_QList<QList<QVariant>_>.d.size,1,
                                    "proxyRowsInsertedSpy.count()","1",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                    ,0x164);
            if (cVar3 != '\0') {
              QList<QList<QVariant>_>::value
                        (&args,&proxyRowsInsertedSpy.super_QList<QList<QVariant>_>,0);
              QList<QList<QVariant>_>::clear(&proxyRowsInsertedSpy.super_QList<QList<QVariant>_>);
              QList<QVariant>::value((QVariant *)&local_240,&args,0);
              qvariant_cast<QModelIndex>((QModelIndex *)&local_218,(QVariant *)&local_240);
              bVar4 = true;
              if ((-1 < (int)local_218._0_4_) && (-1 < (long)local_218.shared)) {
                bVar4 = local_218._16_8_ == 0;
              }
              cVar3 = QTest::qVerify(bVar4,"!args.value(0).value<QModelIndex>().isValid()","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                     ,0x167);
              QVariant::~QVariant((QVariant *)&local_240);
              if (cVar3 != '\0') {
                QList<QVariant>::value((QVariant *)&local_240,&args,1);
                iVar9 = QVariant::toInt((bool *)local_240.data);
                cVar3 = QTest::qCompare(iVar9,uVar1,"args.value(1).toInt()","indexToInsert",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                        ,0x168);
                QVariant::~QVariant((QVariant *)&local_240);
                if (cVar3 != '\0') {
                  QList<QVariant>::value((QVariant *)&local_240,&args,2);
                  iVar9 = QVariant::toInt((bool *)local_240.data);
                  cVar3 = QTest::qCompare(iVar9,uVar1,"args.value(2).toInt()","indexToInsert",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                          ,0x169);
                  QVariant::~QVariant((QVariant *)&local_240);
                  if (cVar3 != '\0') {
                    local_240._forAlignment = -NAN;
                    local_240._8_8_ = 0;
                    local_240._16_8_ = 0;
                    iVar9 = (**(code **)(*(long *)local_220 + 0x78))();
                    uVar8 = (int)local_168 + 1;
                    local_158 = (ulong)uVar8;
                    cVar3 = QTest::qCompare(iVar9,uVar8,"baseModel->rowCount()",
                                            "originalRowCount + 1",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                            ,0x16a);
                    if (cVar3 != '\0') {
                      local_240._forAlignment = -NAN;
                      local_240._8_8_ = 0;
                      local_240._16_8_ = 0;
                      iVar9 = (**(code **)(*(long *)local_220 + 0x80))();
                      cVar3 = QTest::qCompare(iVar9,iVar7,"baseModel->columnCount()",
                                              "originalColCount",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                              ,0x16b);
                      if (cVar3 != '\0') {
                        local_240._forAlignment = -NAN;
                        local_240._8_8_ = 0;
                        local_240._16_8_ = 0;
                        iVar9 = InsertProxyModel::rowCount((QModelIndex *)&proxy);
                        cVar3 = QTest::qCompare(iVar9,(uVar16 & 1) + (int)local_158,
                                                "proxy.rowCount()",
                                                "originalRowCount + 1 + bool(insertDirection & InsertProxyModel::InsertRow)"
                                                ,
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                ,0x16c);
                        if (cVar3 != '\0') {
                          local_240._forAlignment = -NAN;
                          local_240._8_8_ = 0;
                          local_240._16_8_ = 0;
                          iVar9 = InsertProxyModel::columnCount((QModelIndex *)&proxy);
                          cVar3 = QTest::qCompare(iVar9,iVar7 + (uint)((uVar16 >> 1 & 1) != 0),
                                                  "proxy.columnCount()",
                                                  "originalColCount + bool(insertDirection & InsertProxyModel::InsertColumn)"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x16d);
                          if (cVar3 != '\0') {
                            for (uVar8 = 0; (int)uVar8 <= (int)local_168; uVar8 = uVar8 + 1) {
                              iVar9 = 0;
                              while (local_15c != iVar9) {
                                local_1d8.r = -1;
                                local_1d8.c = -1;
                                local_1d8.i = 0;
                                local_1d8.m = (QAbstractItemModel *)0x0;
                                InsertProxyModel::index
                                          ((int)&local_1f0,(int)&proxy,(QModelIndex *)(ulong)uVar8);
                                QModelIndex::data((QVariant *)&local_240,&local_1f0,0);
                                local_188.d = (Data *)0xffffffffffffffff;
                                local_188.ptr = (char16_t *)0x0;
                                local_188.size = 0;
                                (**(code **)(*(long *)local_220 + 0x60))
                                          (&local_1a0,local_220,uVar8,iVar9,&local_188);
                                QModelIndex::data((QVariant *)&local_218,&local_1a0,0);
                                bVar4 = QTest::qCompare<QVariant,QVariant>
                                                  ((QVariant *)&local_240,(QVariant *)&local_218,
                                                   "proxy.index(i, j).data()",
                                                   "baseModel->index(i, j).data()",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x170);
                                QVariant::~QVariant((QVariant *)&local_218);
                                QVariant::~QVariant((QVariant *)&local_240);
                                iVar9 = iVar9 + 1;
                                if (!bVar4) goto LAB_0010ef3f;
                              }
                            }
                            iVar9 = 0;
LAB_0010e8a4:
                            if (local_15c != iVar9) {
                              local_1f0.r = -1;
                              local_1f0.c = -1;
                              local_1f0.i = 0;
                              local_1f0.m = (QAbstractItemModel *)0x0;
                              InsertProxyModel::index((int)&local_218,(int)&proxy,pQVar17);
                              QModelIndex::data((QVariant *)&local_240,(QModelIndex *)&local_218,0);
                              bVar4 = (bool)QVariant::isNull();
                              cVar3 = QTest::qVerify(bVar4,
                                                  "proxy.index(indexToInsert, j).data().isNull()",""
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x174);
                              QVariant::~QVariant((QVariant *)&local_240);
                              if (cVar3 != '\0') goto code_r0x0010e923;
                              goto LAB_0010ef3f;
                            }
                            insertDirection.i._0_1_ = (byte)uVar16;
                            if ((uVar16 & 2) != 0) {
                              if ((int)uVar1 < (int)local_168) {
                                local_1d8.r = -1;
                                local_1d8.c = -1;
                                local_1d8.i = 0;
                                local_1d8.m = (QAbstractItemModel *)0x0;
                                InsertProxyModel::index
                                          ((int)&local_1f0,(int)&proxy,
                                           (QModelIndex *)(ulong)(uVar1 + 1));
                                QModelIndex::data((QVariant *)&local_240,&local_1f0,0);
                                QVariant::toString();
                                local_1a0.r = 0;
                                local_1a0.c = 0;
                                local_1a0.i = 0x11f882;
                                local_1a0.m = (QAbstractItemModel *)0xf;
                                local_188.d = (Data *)0x0;
                                local_188.ptr = (char16_t *)0x0;
                                local_188.size = 0;
                                bVar4 = QTest::qCompare((QString *)&local_218,(QString *)&local_1a0,
                                                                                                                
                                                  "proxy.index(indexToInsert + 1, originalColCount).data().toString()"
                                                  ,"QStringLiteral(\"TestColumnAfter\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x179);
                                QArrayDataPointer<char16_t>::~QArrayDataPointer
                                          ((QArrayDataPointer<char16_t> *)&local_1a0);
                                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_188);
                                QArrayDataPointer<char16_t>::~QArrayDataPointer
                                          ((QArrayDataPointer<char16_t> *)&local_218);
                                QVariant::~QVariant((QVariant *)&local_240);
                                if (!bVar4) goto LAB_0010ef3f;
                              }
                              if (0 < (int)uVar1) {
                                local_1d8.r = -1;
                                local_1d8.c = -1;
                                local_1d8.i = 0;
                                local_1d8.m = (QAbstractItemModel *)0x0;
                                InsertProxyModel::index
                                          ((int)&local_1f0,(int)&proxy,
                                           (QModelIndex *)(ulong)(uVar1 - 1));
                                QModelIndex::data((QVariant *)&local_240,&local_1f0,0);
                                QVariant::toString();
                                local_1a0.r = 0;
                                local_1a0.c = 0;
                                local_1a0.i = 0x11f860;
                                local_1a0.m = (QAbstractItemModel *)0x10;
                                local_188.d = (Data *)0x0;
                                local_188.ptr = (char16_t *)0x0;
                                local_188.size = 0;
                                bVar4 = QTest::qCompare((QString *)&local_218,(QString *)&local_1a0,
                                                                                                                
                                                  "proxy.index(indexToInsert - 1, originalColCount).data().toString()"
                                                  ,"QStringLiteral(\"TestColumnBefore\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x17b);
                                QArrayDataPointer<char16_t>::~QArrayDataPointer
                                          ((QArrayDataPointer<char16_t> *)&local_1a0);
                                QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_188);
                                QArrayDataPointer<char16_t>::~QArrayDataPointer
                                          ((QArrayDataPointer<char16_t> *)&local_218);
                                QVariant::~QVariant((QVariant *)&local_240);
                                if (!bVar4) goto LAB_0010ef3f;
                              }
                            }
                            uVar6 = InsertProxyModel::commitRow();
                            local_240.data[0] = uVar6;
                            local_218.shared =
                                 (PrivateShared *)
                                 (CONCAT71(local_218._1_7_,(byte)insertDirection.i) &
                                 0xffffffffffffff01);
                            bVar4 = QTest::qCompare<bool,bool>
                                              ((bool *)local_240.data,(bool *)local_218.data,
                                               "proxy.commitRow()",
                                               "bool(insertDirection & InsertProxyModel::InsertRow)"
                                               ,
                                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                               ,0x17d);
                            if (bVar4) {
                              uVar6 = InsertProxyModel::commitColumn();
                              local_240.data[0] = uVar6;
                              local_218.shared =
                                   (PrivateShared *)
                                   (CONCAT71(local_218._1_7_,(byte)insertDirection.i >> 1) &
                                   0xffffffffffffff01);
                              bVar4 = QTest::qCompare<bool,bool>
                                                ((bool *)local_240.data,(bool *)local_218.data,
                                                 "proxy.commitColumn()",
                                                 "bool(insertDirection & InsertProxyModel::InsertColumn)"
                                                 ,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                 ,0x17e);
                              if (bVar4) {
                                for (uVar8 = 0; (int)uVar8 < (int)((int)local_158 + (uVar16 & 1));
                                    uVar8 = uVar8 + 1) {
                                  iVar9 = 0;
                                  while (iVar9 < (int)(iVar7 + (uint)((uVar16 >> 1 & 1) != 0))) {
                                    local_1d8.r = -1;
                                    local_1d8.c = -1;
                                    local_1d8.i = 0;
                                    local_1d8.m = (QAbstractItemModel *)0x0;
                                    InsertProxyModel::index
                                              ((int)&local_1f0,(int)&proxy,
                                               (QModelIndex *)(ulong)uVar8);
                                    QModelIndex::data((QVariant *)&local_240,&local_1f0,0);
                                    local_188.d = (Data *)0xffffffffffffffff;
                                    local_188.ptr = (char16_t *)0x0;
                                    local_188.size = 0;
                                    (**(code **)(*(long *)local_220 + 0x60))
                                              (&local_1a0,local_220,uVar8,iVar9,&local_188);
                                    QModelIndex::data((QVariant *)&local_218,&local_1a0,0);
                                    bVar4 = QTest::qCompare<QVariant,QVariant>
                                                      ((QVariant *)&local_240,(QVariant *)&local_218
                                                       ,"proxy.index(i, j).data()",
                                                       "baseModel->index(i, j).data()",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x181);
                                    QVariant::~QVariant((QVariant *)&local_218);
                                    QVariant::~QVariant((QVariant *)&local_240);
                                    iVar9 = iVar9 + 1;
                                    if (!bVar4) goto LAB_0010ef3f;
                                  }
                                }
                                if ((uVar16 & 1) == 0) {
LAB_0010ef31:
                                  if ((uVar16 & 2) != 0) {
                                    if ((int)uVar1 < (int)local_168) {
                                      local_1d8.r = -1;
                                      local_1d8.c = -1;
                                      local_1d8.i = 0;
                                      local_1d8.m = (QAbstractItemModel *)0x0;
                                      (**(code **)(*(long *)local_220 + 0x60))
                                                (&local_1f0,local_220,uVar1 + 1,iVar7);
                                      QModelIndex::data((QVariant *)&local_240,&local_1f0,0);
                                      QVariant::toString();
                                      local_1a0.r = 0;
                                      local_1a0.c = 0;
                                      local_1a0.i = 0x11f882;
                                      local_1a0.m = (QAbstractItemModel *)0xf;
                                      local_188.d = (Data *)0x0;
                                      local_188.ptr = (char16_t *)0x0;
                                      local_188.size = 0;
                                      bVar4 = QTest::qCompare((QString *)&local_218,
                                                              (QString *)&local_1a0,
                                                                                                                            
                                                  "baseModel->index(indexToInsert + 1, originalColCount).data().toString()"
                                                  ,"QStringLiteral(\"TestColumnAfter\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x18b);
                                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                ((QArrayDataPointer<char16_t> *)&local_1a0);
                                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_188);
                                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                ((QArrayDataPointer<char16_t> *)&local_218);
                                      QVariant::~QVariant((QVariant *)&local_240);
                                      if (!bVar4) goto LAB_0010ef3f;
                                    }
                                    if (0 < (int)uVar1) {
                                      local_1d8.r = -1;
                                      local_1d8.c = -1;
                                      local_1d8.i = 0;
                                      local_1d8.m = (QAbstractItemModel *)0x0;
                                      (**(code **)(*(long *)local_220 + 0x60))
                                                (&local_1f0,local_220,uVar1 - 1,iVar7);
                                      QModelIndex::data((QVariant *)&local_240,&local_1f0,0);
                                      QVariant::toString();
                                      local_1a0.r = 0;
                                      local_1a0.c = 0;
                                      local_1a0.i = 0x11f860;
                                      local_1a0.m = (QAbstractItemModel *)0x10;
                                      local_188.d = (Data *)0x0;
                                      local_188.ptr = (char16_t *)0x0;
                                      local_188.size = 0;
                                      bVar4 = QTest::qCompare((QString *)&local_218,
                                                              (QString *)&local_1a0,
                                                                                                                            
                                                  "baseModel->index(indexToInsert - 1, originalColCount).data().toString()"
                                                  ,"QStringLiteral(\"TestColumnBefore\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x18d);
                                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                ((QArrayDataPointer<char16_t> *)&local_1a0);
                                      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_188);
                                      QArrayDataPointer<char16_t>::~QArrayDataPointer
                                                ((QArrayDataPointer<char16_t> *)&local_218);
                                      QVariant::~QVariant((QVariant *)&local_240);
                                      if (!bVar4) goto LAB_0010ef3f;
                                    }
                                    uVar16 = 0;
                                    while( true ) {
                                      local_240._forAlignment = -NAN;
                                      local_240._8_8_ = 0;
                                      local_240._16_8_ = 0;
                                      iVar7 = InsertProxyModel::rowCount((QModelIndex *)&proxy);
                                      if (iVar7 <= (int)uVar16) break;
                                      local_1d8.r = -1;
                                      local_1d8.c = -1;
                                      local_1d8.i = 0;
                                      local_1d8.m = (QAbstractItemModel *)0x0;
                                      (**(code **)(*(long *)local_220 + 0x80))(local_220,&local_1d8)
                                      ;
                                      local_1a0.r = -1;
                                      local_1a0.c = -1;
                                      local_1a0.i = 0;
                                      local_1a0.m = (QAbstractItemModel *)0x0;
                                      InsertProxyModel::index
                                                ((int)&local_1f0,(int)(QModelIndex *)&proxy,
                                                 (QModelIndex *)(ulong)uVar16);
                                      QModelIndex::data((QVariant *)&local_240,&local_1f0,0);
                                      local_218.shared = (PrivateShared *)0x0;
                                      local_218._8_8_ = 0;
                                      local_218._16_8_ = 0;
                                      local_200 = 2;
                                      bVar4 = QTest::qCompare<QVariant,QVariant>
                                                        ((QVariant *)&local_240,
                                                         (QVariant *)&local_218,
                                                                                                                  
                                                  "proxy.index(i, baseModel->columnCount()).data()",
                                                  "QVariant()",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,399);
                                      QVariant::~QVariant((QVariant *)&local_218);
                                      QVariant::~QVariant((QVariant *)&local_240);
                                      uVar16 = uVar16 + 1;
                                      if (!bVar4) goto LAB_0010ef3f;
                                    }
                                  }
                                  QObject::deleteLater();
                                }
                                else {
                                  local_1d8.r = -1;
                                  local_1d8.c = -1;
                                  local_1d8.i = 0;
                                  local_1d8.m = (QAbstractItemModel *)0x0;
                                  (**(code **)(*(long *)local_220 + 0x60))
                                            (&local_1f0,local_220,local_158,0);
                                  QModelIndex::data((QVariant *)&local_240,&local_1f0,0);
                                  QVariant::toString();
                                  local_1a0.r = 0;
                                  local_1a0.c = 0;
                                  local_1a0.i = 0x11f850;
                                  local_1a0.m = (QAbstractItemModel *)0x7;
                                  local_188.d = (Data *)0x0;
                                  local_188.ptr = (char16_t *)0x0;
                                  local_188.size = 0;
                                  bVar4 = QTest::qCompare((QString *)&local_218,
                                                          (QString *)&local_1a0,
                                                                                                                    
                                                  "baseModel->index(originalRowCount + 1, 0).data().toString()"
                                                  ,"QStringLiteral(\"TestRow\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x185);
                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                            ((QArrayDataPointer<char16_t> *)&local_1a0);
                                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_188);
                                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                                            ((QArrayDataPointer<char16_t> *)&local_218);
                                  QVariant::~QVariant((QVariant *)&local_240);
                                  if (bVar4) {
                                    iVar9 = 0;
                                    do {
                                      local_240._forAlignment = -NAN;
                                      local_240._8_8_ = 0;
                                      local_240._16_8_ = 0;
                                      iVar11 = InsertProxyModel::columnCount((QModelIndex *)&proxy);
                                      if (iVar11 <= iVar9) goto LAB_0010ef31;
                                      local_1d8.r = -1;
                                      local_1d8.c = -1;
                                      local_1d8.i = 0;
                                      local_1d8.m = (QAbstractItemModel *)0x0;
                                      uVar8 = (**(code **)(*(long *)local_220 + 0x78))
                                                        (local_220,&local_1d8);
                                      local_1a0.r = -1;
                                      local_1a0.c = -1;
                                      local_1a0.i = 0;
                                      local_1a0.m = (QAbstractItemModel *)0x0;
                                      InsertProxyModel::index
                                                ((int)&local_1f0,(int)(QModelIndex *)&proxy,
                                                 (QModelIndex *)(ulong)uVar8);
                                      QModelIndex::data((QVariant *)&local_240,&local_1f0,0);
                                      local_218.shared = (PrivateShared *)0x0;
                                      local_218._8_8_ = 0;
                                      local_218._16_8_ = 0;
                                      local_200 = 2;
                                      bVar4 = QTest::qCompare<QVariant,QVariant>
                                                        ((QVariant *)&local_240,
                                                         (QVariant *)&local_218,
                                                                                                                  
                                                  "proxy.index(baseModel->rowCount(), i).data()",
                                                  "QVariant()",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                                  ,0x187);
                                      QVariant::~QVariant((QVariant *)&local_218);
                                      QVariant::~QVariant((QVariant *)&local_240);
                                      iVar9 = iVar9 + 1;
                                    } while (bVar4);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
LAB_0010ef3f:
              QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
            }
          }
        }
        else {
          args.d.d = (Data *)0xffffffffffffffff;
          args.d.ptr = (QVariant *)0x0;
          args.d.size = 0;
          InsertProxyModel::index((int)&local_218,(int)&proxy,local_168);
          local_1f0.r = 0;
          local_1f0.c = 0;
          local_1f0.i = 0x11f850;
          local_1f0.m = (QAbstractItemModel *)0x7;
          local_1d8.r = 0;
          local_1d8.c = 0;
          local_1d8.i = 0;
          local_1d8.m = (QAbstractItemModel *)0x0;
          QVariant::QVariant((QVariant *)&local_240,(QString *)&local_1f0);
          bVar4 = (bool)InsertProxyModel::setData
                                  ((QModelIndex *)&proxy,(QVariant *)&local_218,(int)&local_240);
          cVar3 = QTest::qVerify(bVar4,
                                 "proxy.setData(proxy.index(originalRowCount, 0), QStringLiteral(\"TestRow\"))"
                                 ,"",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                 ,0x150);
          QVariant::~QVariant((QVariant *)&local_240);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1f0)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1d8)
          ;
          if (cVar3 != '\0') {
            local_240._forAlignment = -NAN;
            local_240._8_8_ = 0;
            local_240._16_8_ = 0;
            uVar10 = InsertProxyModel::rowCount((QModelIndex *)&proxy);
            local_218._forAlignment = -NAN;
            local_218._8_8_ = 0;
            local_218._16_8_ = 0;
            bVar5 = (**(code **)(_proxy + 0xf8))(&proxy,uVar10,1);
            cVar3 = QTest::qVerify((bool)(bVar5 ^ 1),"!proxy.insertRow(proxy.rowCount())","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                   ,0x151);
            if (cVar3 != '\0') goto LAB_0010df7e;
          }
        }
      }
    }
  }
LAB_0010ef4c:
  QSignalSpy::~QSignalSpy(&baseRowsInsertedSpy);
LAB_0010ef59:
  QSignalSpy::~QSignalSpy(&proxyRowsInsertedSpy);
  InsertProxyModel::~InsertProxyModel(&proxy);
  return;
code_r0x0010e923:
  local_1f0.r = -1;
  local_1f0.c = -1;
  local_1f0.i = 0;
  local_1f0.m = (QAbstractItemModel *)0x0;
  (**(code **)(*(long *)local_220 + 0x60))(&local_218,local_220,pQVar17,iVar9,&local_1f0);
  QModelIndex::data((QVariant *)&local_240,(QModelIndex *)&local_218,0);
  bVar4 = (bool)QVariant::isNull();
  cVar3 = QTest::qVerify(bVar4,"baseModel->index(indexToInsert, j).data().isNull()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                         ,0x175);
  QVariant::~QVariant((QVariant *)&local_240);
  iVar9 = iVar9 + 1;
  if (cVar3 == '\0') goto LAB_0010ef3f;
  goto LAB_0010e8a4;
}

Assistant:

void tst_InsertProxyModel::testSourceInsertRow()
{
    QFETCH(QAbstractItemModel *, baseModel);
    QFETCH(InsertProxyModel::InsertDirections, insertDirection);
    QFETCH(int, indexToInsert);
    QFETCH(bool, addViaProxy);
    InsertProxyModel proxy;
    new ModelTest(&proxy, baseModel);
    proxy.setSourceModel(baseModel);
    proxy.setInsertDirection(insertDirection);
    QSignalSpy proxyRowsInsertedSpy(&proxy, SIGNAL(rowsInserted(QModelIndex, int, int)));
    QVERIFY(proxyRowsInsertedSpy.isValid());
    QSignalSpy baseRowsInsertedSpy(baseModel, SIGNAL(rowsInserted(QModelIndex, int, int)));
    QVERIFY(baseRowsInsertedSpy.isValid());
    const int originalColCount = baseModel->columnCount();
    const int originalRowCount = baseModel->rowCount();
    QCOMPARE(proxy.rowCount(), originalRowCount + bool(insertDirection & InsertProxyModel::InsertRow));
    QCOMPARE(proxy.columnCount(), originalColCount + bool(insertDirection & InsertProxyModel::InsertColumn));
    if (insertDirection & InsertProxyModel::InsertRow) {
        QVERIFY(proxy.setData(proxy.index(originalRowCount, 0), QStringLiteral("TestRow")));
        QVERIFY(!proxy.insertRow(proxy.rowCount()));
    }
    if (insertDirection & InsertProxyModel::InsertColumn) {
        if (indexToInsert > 0)
            QVERIFY(proxy.setData(proxy.index(indexToInsert - 1, originalColCount), QStringLiteral("TestColumnBefore")));
        if (indexToInsert < originalRowCount)
            QVERIFY(proxy.setData(proxy.index(indexToInsert, originalColCount), QStringLiteral("TestColumnAfter")));
    }
    for (int i = 0; i < originalRowCount; ++i) {
        for (int j = 0; j < originalColCount; ++j) {
            QCOMPARE(proxy.index(i, j).data(), baseModel->index(i, j).data());
        }
    }
    if (addViaProxy)
        QVERIFY(proxy.insertRow(indexToInsert));
    else
        QVERIFY(baseModel->insertRow(indexToInsert));
    QCOMPARE(baseRowsInsertedSpy.count(), 1);
    baseRowsInsertedSpy.clear();
    QCOMPARE(proxyRowsInsertedSpy.count(), 1);
    const auto args = proxyRowsInsertedSpy.value(0);
    proxyRowsInsertedSpy.clear();
    QVERIFY(!args.value(0).value<QModelIndex>().isValid());
    QCOMPARE(args.value(1).toInt(), indexToInsert);
    QCOMPARE(args.value(2).toInt(), indexToInsert);
    QCOMPARE(baseModel->rowCount(), originalRowCount + 1);
    QCOMPARE(baseModel->columnCount(), originalColCount);
    QCOMPARE(proxy.rowCount(), originalRowCount + 1 + bool(insertDirection & InsertProxyModel::InsertRow));
    QCOMPARE(proxy.columnCount(), originalColCount + bool(insertDirection & InsertProxyModel::InsertColumn));
    for (int i = 0; i < originalRowCount + 1; ++i) {
        for (int j = 0; j < originalColCount; ++j) {
            QCOMPARE(proxy.index(i, j).data(), baseModel->index(i, j).data());
        }
    }
    for (int j = 0; j < originalColCount; ++j) {
        QVERIFY(proxy.index(indexToInsert, j).data().isNull());
        QVERIFY(baseModel->index(indexToInsert, j).data().isNull());
    }
    if (insertDirection & InsertProxyModel::InsertColumn) {
        if (indexToInsert < originalRowCount)
            QCOMPARE(proxy.index(indexToInsert + 1, originalColCount).data().toString(), QStringLiteral("TestColumnAfter"));
        if (indexToInsert > 0)
            QCOMPARE(proxy.index(indexToInsert - 1, originalColCount).data().toString(), QStringLiteral("TestColumnBefore"));
    }
    QCOMPARE(proxy.commitRow(), bool(insertDirection & InsertProxyModel::InsertRow));
    QCOMPARE(proxy.commitColumn(), bool(insertDirection & InsertProxyModel::InsertColumn));
    for (int i = 0; i < originalRowCount + 1 + bool(insertDirection & InsertProxyModel::InsertRow); ++i) {
        for (int j = 0; j < originalColCount + bool(insertDirection & InsertProxyModel::InsertColumn); ++j) {
            QCOMPARE(proxy.index(i, j).data(), baseModel->index(i, j).data());
        }
    }
    if (insertDirection & InsertProxyModel::InsertRow) {
        QCOMPARE(baseModel->index(originalRowCount + 1, 0).data().toString(), QStringLiteral("TestRow"));
        for (int i = 0; i < proxy.columnCount(); ++i)
            QCOMPARE(proxy.index(baseModel->rowCount(), i).data(), QVariant());
    }
    if (insertDirection & InsertProxyModel::InsertColumn) {
        if (indexToInsert < originalRowCount)
            QCOMPARE(baseModel->index(indexToInsert + 1, originalColCount).data().toString(), QStringLiteral("TestColumnAfter"));
        if (indexToInsert > 0)
            QCOMPARE(baseModel->index(indexToInsert - 1, originalColCount).data().toString(), QStringLiteral("TestColumnBefore"));
        for (int i = 0; i < proxy.rowCount(); ++i)
            QCOMPARE(proxy.index(i, baseModel->columnCount()).data(), QVariant());
    }
    baseModel->deleteLater();
}